

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

char * Cba_FonNameStr(Cba_Ntk_t *p,int f)

{
  int iVar1;
  char *pcVar2;
  int f_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_NtkHasFonNames(p);
  if (iVar1 == 0) {
    __assert_fail("Cba_NtkHasFonNames(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
  }
  iVar1 = Cba_FonIsReal(f);
  if (iVar1 != 0) {
    iVar1 = Cba_FonName(p,f);
    pcVar2 = Cba_NtkStr(p,iVar1);
    return pcVar2;
  }
  __assert_fail("Cba_FonIsReal(f)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
}

Assistant:

static inline char *         Cba_FonNameStr( Cba_Ntk_t * p, int f )          { assert(Cba_NtkHasFonNames(p)); assert(Cba_FonIsReal(f)); return Cba_NtkStr(p, Cba_FonName(p, f));                          }